

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::anon_unknown_0::strlength_wide(wchar_t *s)

{
  wchar_t *local_18;
  wchar_t *end;
  wchar_t *s_local;
  
  local_18 = s;
  if (s == (wchar_t *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x107,"size_t pugi::impl::(anonymous namespace)::strlength_wide(const wchar_t *)"
                 );
  }
  for (; *local_18 != L'\0'; local_18 = local_18 + 1) {
  }
  return (long)local_18 - (long)s >> 2;
}

Assistant:

PUGI_IMPL_FN size_t strlength_wide(const wchar_t* s)
	{
		assert(s);

	#ifdef PUGIXML_WCHAR_MODE
		return wcslen(s);
	#else
		const wchar_t* end = s;
		while (*end) end++;
		return static_cast<size_t>(end - s);
	#endif
	}